

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O2

char * __thiscall
CVmDateLocale::index_list(CVmDateLocale *this,size_t *itemlen,int item,int idx,int sticky)

{
  char *src;
  char *pcVar1;
  size_t sVar2;
  char *local_30;
  
  src = get(this,(size_t *)&local_30,item);
  if (src == (char *)0x0) {
LAB_0024e246:
    *itemlen = 0;
    src = (char *)0x0;
  }
  else {
    while( true ) {
      if ((idx < 1) || (local_30 == (char *)0x0)) goto LAB_0024e21c;
      pcVar1 = lib_strnchr(src,(size_t)local_30,0x2c);
      if (pcVar1 == (char *)0x0) break;
      idx = idx + -1;
      local_30 = src + ~(ulong)pcVar1 + (long)local_30;
      src = pcVar1 + 1;
    }
    if (sticky == 0) goto LAB_0024e246;
LAB_0024e21c:
    sVar2 = 0;
    while( true ) {
      local_30 = local_30 + -1;
      *itemlen = sVar2;
      if (((local_30 == (char *)0xffffffffffffffff) || (src[sVar2] == ',')) || (src[sVar2] == '='))
      break;
      sVar2 = sVar2 + 1;
    }
  }
  return src;
}

Assistant:

const char *index_list(VMG_ size_t &itemlen, int item, int idx, int sticky)
    {
        /* get the item */
        size_t len;
        const char *str = get(vmg_ len, item);

        /* if we didn't find it, return failure */
        if (str == 0)
        {
            itemlen = 0;
            return 0;
        }

        /* skip items (delimited by commas) until we reach the target index */
        for ( ; idx > 0 && len != 0 ; --idx, ++str, --len)
        {
            /* find the next comma */
            const char *comma = lib_strnchr(str, len, ',');
            if (comma == 0)
            {
                /* 
                 *   No more commas, so the index is past the end of the
                 *   list.  If 'sticky' is true, use the last item; otherwise
                 *   return "not found".
                 */
                if (sticky)
                    break;
                else
                {
                    itemlen = 0;
                    return 0;
                }
            }
            
            /* advance to the comma */
            len -= comma - str;
            str = comma;
        }
        
        /* we have the item; measure its length, up to the next '=' or ',' */
        const char *p;
        for (p = str, itemlen = 0 ; len != 0 && *p != '=' && *p != ',' ;
             --len, ++p, ++itemlen) ;
        
        /* return the item pointer */
        return str;
    }